

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

int gray_conic_to(FT_Vector *control,FT_Vector *to,gray_PWorker worker)

{
  gray_PWorker worker_local;
  FT_Vector *to_local;
  FT_Vector *control_local;
  
  gray_render_conic(worker,control,to);
  return 0;
}

Assistant:

static int
  gray_conic_to( const FT_Vector*  control,
                 const FT_Vector*  to,
                 gray_PWorker      worker )
  {
    gray_render_conic( RAS_VAR_ control, to );
    return 0;
  }